

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O0

int test_subdict(xmlDictPtr parent)

{
  undefined4 uVar1;
  int iVar2;
  long lVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  xmlChar *tmp;
  xmlChar *pref;
  xmlChar *cur;
  xmlChar prefix [40];
  int local_24;
  int ret;
  xmlDictPtr dict;
  int j;
  int i;
  xmlDictPtr parent_local;
  
  local_24 = 0;
  lVar3 = xmlDictCreateSub(parent);
  if (lVar3 != 0) {
    memset(test2,0,8);
    for (dict._4_4_ = 0; (int)dict._4_4_ < 10; dict._4_4_ = dict._4_4_ + 1) {
      pxVar4 = (xmlChar *)xmlDictLookup(lVar3,strings2[(int)dict._4_4_],0xffffffff);
      test2[(int)dict._4_4_] = pxVar4;
      if (test2[(int)dict._4_4_] == (xmlChar *)0x0) {
        fprintf(_stderr,"Failed lookup for \'%s\'\n",strings2[(int)dict._4_4_]);
        local_24 = 1;
        nbErrors = nbErrors + 1;
      }
    }
    dict._0_4_ = 90000;
    for (dict._4_4_ = 0; (int)dict._4_4_ < 10; dict._4_4_ = dict._4_4_ + 1) {
      pxVar4 = strings2[(int)dict];
      uVar1 = xmlStrlen(strings2[(int)dict]);
      pxVar4 = (xmlChar *)xmlDictLookup(lVar3,pxVar4,uVar1);
      test2[(int)dict] = pxVar4;
      if (test2[(int)dict] == (xmlChar *)0x0) {
        fprintf(_stderr,"Failed lookup for \'%s\'\n",strings2[(int)dict]);
        local_24 = 1;
        nbErrors = nbErrors + 1;
      }
      dict._0_4_ = (int)dict + 1;
    }
    dict._0_4_ = 0x18696;
    for (dict._4_4_ = 0; (int)dict._4_4_ < 10; dict._4_4_ = dict._4_4_ + 1) {
      pxVar4 = strings2[(int)dict];
      uVar1 = xmlStrlen(strings2[(int)dict]);
      pxVar4 = (xmlChar *)xmlDictLookup(lVar3,pxVar4,uVar1);
      test2[(int)dict] = pxVar4;
      if (test2[(int)dict] == (xmlChar *)0x0) {
        fprintf(_stderr,"Failed lookup for \'%s\'\n",strings2[(int)dict]);
        local_24 = 1;
        nbErrors = nbErrors + 1;
      }
      dict._0_4_ = (int)dict + 1;
    }
    for (dict._4_4_ = 0; (int)dict._4_4_ < 100000; dict._4_4_ = dict._4_4_ + 1) {
      if (test2[(int)dict._4_4_] == (xmlChar *)0x0) {
        pxVar4 = (xmlChar *)xmlDictLookup(lVar3,strings2[(int)dict._4_4_],0xffffffff);
        test2[(int)dict._4_4_] = pxVar4;
        if (test2[(int)dict._4_4_] == (xmlChar *)0x0) {
          fprintf(_stderr,"Failed lookup for \'%s\'\n",strings2[(int)dict._4_4_]);
          local_24 = 1;
          nbErrors = nbErrors + 1;
        }
      }
    }
    for (dict._4_4_ = 0; (int)dict._4_4_ < 100000; dict._4_4_ = dict._4_4_ + 1) {
      iVar2 = xmlDictOwns(lVar3,test2[(int)dict._4_4_]);
      if (iVar2 == 0) {
        fprintf(_stderr,"Failed ownership failure for \'%s\'\n",strings2[(int)dict._4_4_]);
        local_24 = 1;
        nbErrors = nbErrors + 1;
      }
      iVar2 = xmlDictOwns(parent,test2[(int)dict._4_4_]);
      if (iVar2 != 0) {
        fprintf(_stderr,"Failed parent ownership failure for \'%s\'\n",strings2[(int)dict._4_4_]);
        local_24 = 1;
        nbErrors = nbErrors + 1;
      }
    }
    for (dict._4_4_ = 0; (int)dict._4_4_ < 100000; dict._4_4_ = dict._4_4_ + 1) {
      iVar2 = xmlDictOwns(lVar3,test1[(int)dict._4_4_]);
      if (iVar2 == 0) {
        fprintf(_stderr,"Failed sub-ownership failure for \'%s\'\n",strings1[(int)dict._4_4_]);
        local_24 = 1;
        nbErrors = nbErrors + 1;
      }
    }
    for (dict._4_4_ = 0; (int)dict._4_4_ < 100000; dict._4_4_ = dict._4_4_ + 1) {
      pxVar4 = (xmlChar *)xmlDictLookup(lVar3,strings2[(int)dict._4_4_],0xffffffff);
      if (pxVar4 != test2[(int)dict._4_4_]) {
        fprintf(_stderr,"Failed re-lookup check for %d, \'%s\'\n",(ulong)dict._4_4_,
                strings2[(int)dict._4_4_]);
        local_24 = 1;
        nbErrors = nbErrors + 1;
      }
    }
    for (dict._4_4_ = 0; (int)dict._4_4_ < 100000; dict._4_4_ = dict._4_4_ + 1) {
      pxVar4 = (xmlChar *)xmlDictLookup(lVar3,strings1[(int)dict._4_4_],0xffffffff);
      if (pxVar4 != test1[(int)dict._4_4_]) {
        fprintf(_stderr,"Failed parent string lookup check for %d, \'%s\'\n",(ulong)dict._4_4_,
                strings1[(int)dict._4_4_]);
        local_24 = 1;
        nbErrors = nbErrors + 1;
      }
    }
    for (dict._4_4_ = 90000; (int)dict._4_4_ < 100000; dict._4_4_ = dict._4_4_ + 1) {
      tmp = (xmlChar *)&cur;
      pref = strings2[(int)dict._4_4_];
      while (*pref != ':') {
        *tmp = *pref;
        tmp = tmp + 1;
        pref = pref + 1;
      }
      *tmp = '\0';
      pxVar4 = (xmlChar *)xmlDictQLookup(lVar3,&cur,pref + 1);
      if (pxVar4 != test2[(int)dict._4_4_]) {
        fprintf(_stderr,"Failed lookup check for \'%s\':\'%s\'\n",&cur,pref + 1);
        local_24 = 1;
        nbErrors = nbErrors + 1;
      }
    }
    for (dict._4_4_ = 90000; (int)dict._4_4_ < 100000; dict._4_4_ = dict._4_4_ + 1) {
      tmp = (xmlChar *)&cur;
      pref = strings1[(int)dict._4_4_];
      while (*pref != ':') {
        *tmp = *pref;
        tmp = tmp + 1;
        pref = pref + 1;
      }
      pxVar4 = pref + 1;
      *tmp = '\0';
      xmlDictQLookup(lVar3,&cur,pxVar4);
      pxVar5 = (xmlChar *)xmlDictQLookup(lVar3,&cur,pxVar4);
      if (pxVar5 != test1[(int)dict._4_4_]) {
        fprintf(_stderr,"Failed parent lookup check for \'%s\':\'%s\'\n",&cur,pxVar4);
        local_24 = 1;
        nbErrors = nbErrors + 1;
      }
    }
    xmlDictFree(lVar3);
    return local_24;
  }
  fprintf(_stderr,"Out of memory while creating sub-dictionary\n");
  exit(1);
}

Assistant:

static int
test_subdict(xmlDictPtr parent) {
    int i, j;
    xmlDictPtr dict;
    int ret = 0;
    xmlChar prefix[40];
    xmlChar *cur, *pref;
    const xmlChar *tmp;

    dict = xmlDictCreateSub(parent);
    if (dict == NULL) {
	fprintf(stderr, "Out of memory while creating sub-dictionary\n");
	exit(1);
    }
    /* Cast to avoid buggy warning on MSVC. */
    memset((void *) test2, 0, sizeof(test2));

    /*
     * Fill in NB_STRINGS_MIN, at this point the dictionary should not grow
     * and we allocate all those doing the fast key computations
     * All the strings are based on a different seeds subset so we know
     * they are allocated in the main dictionary, not coming from the parent
     */
    for (i = 0;i < NB_STRINGS_MIN;i++) {
        test2[i] = xmlDictLookup(dict, strings2[i], -1);
	if (test2[i] == NULL) {
	    fprintf(stderr, "Failed lookup for '%s'\n", strings2[i]);
	    ret = 1;
	    nbErrors++;
	}
    }
    j = NB_STRINGS_MAX - NB_STRINGS_NS;
    /* ":foo" like strings2 */
    for (i = 0;i < NB_STRINGS_MIN;i++, j++) {
        test2[j] = xmlDictLookup(dict, strings2[j], xmlStrlen(strings2[j]));
	if (test2[j] == NULL) {
	    fprintf(stderr, "Failed lookup for '%s'\n", strings2[j]);
	    ret = 1;
	    nbErrors++;
	}
    }
    /* "a:foo" like strings2 */
    j = NB_STRINGS_MAX - NB_STRINGS_MIN;
    for (i = 0;i < NB_STRINGS_MIN;i++, j++) {
        test2[j] = xmlDictLookup(dict, strings2[j], xmlStrlen(strings2[j]));
	if (test2[j] == NULL) {
	    fprintf(stderr, "Failed lookup for '%s'\n", strings2[j]);
	    ret = 1;
	    nbErrors++;
	}
    }

    /*
     * At this point allocate all the strings
     * the dictionary will grow in the process, reallocate more string tables
     * and switch to the better key generator
     */
    for (i = 0;i < NB_STRINGS_MAX;i++) {
        if (test2[i] != NULL)
	    continue;
	test2[i] = xmlDictLookup(dict, strings2[i], -1);
	if (test2[i] == NULL) {
	    fprintf(stderr, "Failed lookup for '%s'\n", strings2[i]);
	    ret = 1;
	    nbErrors++;
	}
    }

    /*
     * Now we can start to test things, first that all strings2 belongs to
     * the dict, and that none of them was actually allocated in the parent
     */
    for (i = 0;i < NB_STRINGS_MAX;i++) {
        if (!xmlDictOwns(dict, test2[i])) {
	    fprintf(stderr, "Failed ownership failure for '%s'\n",
	            strings2[i]);
	    ret = 1;
	    nbErrors++;
	}
        if (xmlDictOwns(parent, test2[i])) {
	    fprintf(stderr, "Failed parent ownership failure for '%s'\n",
	            strings2[i]);
	    ret = 1;
	    nbErrors++;
	}
    }

    /*
     * Also verify that all strings from the parent are seen from the subdict
     */
    for (i = 0;i < NB_STRINGS_MAX;i++) {
        if (!xmlDictOwns(dict, test1[i])) {
	    fprintf(stderr, "Failed sub-ownership failure for '%s'\n",
	            strings1[i]);
	    ret = 1;
	    nbErrors++;
	}
    }

    /*
     * Then that another lookup to the string in sub will return the same
     */
    for (i = 0;i < NB_STRINGS_MAX;i++) {
        if (xmlDictLookup(dict, strings2[i], -1) != test2[i]) {
	    fprintf(stderr, "Failed re-lookup check for %d, '%s'\n",
	            i, strings2[i]);
	    ret = 1;
	    nbErrors++;
	}
    }
    /*
     * But also that any lookup for a string in the parent will be provided
     * as in the parent
     */
    for (i = 0;i < NB_STRINGS_MAX;i++) {
        if (xmlDictLookup(dict, strings1[i], -1) != test1[i]) {
	    fprintf(stderr, "Failed parent string lookup check for %d, '%s'\n",
	            i, strings1[i]);
	    ret = 1;
	    nbErrors++;
	}
    }

    /*
     * check the QName lookups
     */
    for (i = NB_STRINGS_MAX - NB_STRINGS_NS;i < NB_STRINGS_MAX;i++) {
        cur = strings2[i];
	pref = &prefix[0];
	while (*cur != ':') *pref++ = *cur++;
	cur++;
	*pref = 0;
	tmp = xmlDictQLookup(dict, &prefix[0], cur);
	if (tmp != test2[i]) {
	    fprintf(stderr, "Failed lookup check for '%s':'%s'\n",
	            &prefix[0], cur);
            ret = 1;
	    nbErrors++;
	}
    }
    /*
     * check the QName lookups for strings from the parent
     */
    for (i = NB_STRINGS_MAX - NB_STRINGS_NS;i < NB_STRINGS_MAX;i++) {
        cur = strings1[i];
	pref = &prefix[0];
	while (*cur != ':') *pref++ = *cur++;
	cur++;
	*pref = 0;
	tmp = xmlDictQLookup(dict, &prefix[0], cur);
	if (xmlDictQLookup(dict, &prefix[0], cur) != test1[i]) {
	    fprintf(stderr, "Failed parent lookup check for '%s':'%s'\n",
	            &prefix[0], cur);
            ret = 1;
	    nbErrors++;
	}
    }

    xmlDictFree(dict);
    return(ret);
}